

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptDate.cpp
# Opt level: O2

Var Js::JavascriptDate::EntryToJSON(RecyclableObject *function,CallInfo callInfo,...)

{
  ImplicitCallFlags IVar1;
  ScriptContext *pSVar2;
  ThreadContext *this;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  Attributes attributes;
  undefined4 *puVar7;
  Var pvVar8;
  RecyclableObject *pRVar9;
  PropertyRecord *pPVar10;
  ScriptContext *scriptContext;
  double value;
  int in_stack_00000010;
  anon_class_24_3_45d37546 local_68;
  CallInfo local_50;
  CallInfo callInfo_local;
  ArgumentReader args;
  Var result;
  RecyclableObject *thisObj;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_50 = callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x4fc,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00a7d57d;
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&callInfo_local,&local_50,(Var *)&stack0x00000018);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_50 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x4ff,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
LAB_00a7d57d:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  if ((callInfo_local._0_4_ & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec41,L"Data.prototype.toJSON");
  }
  result = (Var)0x0;
  pvVar8 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  scriptContext = pSVar2;
  BVar6 = JavascriptConversion::ToObject(pvVar8,pSVar2,(RecyclableObject **)&result);
  if (BVar6 == 0) {
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec42,L"Date.prototype.toJSON");
  }
  args.super_Arguments.Values = (Type)0x0;
  BVar6 = TryInvokeRemotely(EntryToJSON,scriptContext,(Arguments *)&callInfo_local,
                            &args.super_Arguments.Values);
  if (BVar6 != 0) {
    return args.super_Arguments.Values;
  }
  pvVar8 = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>(result,pSVar2);
  if ((ulong)pvVar8 >> 0x32 != 0) {
    value = JavascriptNumber::GetValue(pvVar8);
    bVar4 = NumberUtilities::IsFinite(value);
    if (!bVar4) {
      return (((pSVar2->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             nullValue.ptr;
    }
  }
  pvVar8 = JavascriptOperators::GetProperty
                     ((RecyclableObject *)result,0x16e,pSVar2,(PropertyValueInfo *)0x0);
  bVar4 = JavascriptConversion::IsCallable(pvVar8);
  if (!bVar4) {
    pPVar10 = ScriptContext::GetPropertyName(pSVar2,0x16e);
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec45,(PCWSTR)(pPVar10 + 1));
  }
  pRVar9 = VarTo<Js::RecyclableObject>(pvVar8);
  this = pSVar2->threadContext;
  local_68.thisObj = (RecyclableObject *)result;
  bVar4 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  local_68.scriptContext = pSVar2;
  local_68.toISOFunc = pRVar9;
  attributes = FunctionInfo::GetAttributes(pRVar9);
  bVar5 = ThreadContext::HasNoSideEffect(this,pRVar9,attributes);
  if (bVar5) {
    pRVar9 = (RecyclableObject *)EntryToJSON::anon_class_24_3_45d37546::operator()(&local_68);
    bVar5 = ThreadContext::IsOnStack(pRVar9);
  }
  else {
    if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
      pRVar9 = (((((((((pRVar9->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                   scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).undefinedValue.ptr;
      goto LAB_00a7d54d;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this->implicitCallFlags;
      pRVar9 = (RecyclableObject *)EntryToJSON::anon_class_24_3_45d37546::operator()(&local_68);
      this->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00a7d54d;
    }
    pRVar9 = (RecyclableObject *)EntryToJSON::anon_class_24_3_45d37546::operator()(&local_68);
    bVar5 = ThreadContext::IsOnStack(pRVar9);
  }
  if (bVar5 != false) {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00a7d54d:
  this->reentrancySafeOrHandled = bVar4;
  return pRVar9;
}

Assistant:

Var JavascriptDate::EntryToJSON(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedObject, _u("Data.prototype.toJSON"));
        }
        RecyclableObject* thisObj = nullptr;
        if (FALSE == JavascriptConversion::ToObject(args[0], scriptContext, &thisObj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Date.prototype.toJSON"));
        }

        Var result = nullptr;
        if (TryInvokeRemotely(EntryToJSON, scriptContext, args, &result))
        {
            return result;
        }

        Var num = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(thisObj, scriptContext);
        if (JavascriptNumber::Is(num)
            && !NumberUtilities::IsFinite(JavascriptNumber::GetValue(num)))
        {
            return scriptContext->GetLibrary()->GetNull();
        }

        Var toISO = JavascriptOperators::GetProperty(thisObj, PropertyIds::toISOString, scriptContext, NULL);
        if (!JavascriptConversion::IsCallable(toISO))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_NeedFunction, scriptContext->GetPropertyName(PropertyIds::toISOString)->GetBuffer());
        }
        RecyclableObject* toISOFunc = VarTo<RecyclableObject>(toISO);
        return scriptContext->GetThreadContext()->ExecuteImplicitCall(toISOFunc, Js::ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(scriptContext->GetThreadContext(), toISOFunc, CallInfo(1), thisObj);
        });
    }